

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_complete(char *zSql)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  
  bVar3 = 0;
LAB_0013f548:
  bVar1 = *zSql;
  if (bVar1 < 0x27) {
    if (bVar1 < 0xc) {
      if (bVar1 - 9 < 2) goto LAB_0013f62c;
      if (bVar1 == 0) {
LAB_0013fb75:
        bVar13 = bVar3 == 1;
        goto LAB_0013fb7a;
      }
    }
    else {
      if ((bVar1 - 0xc < 2) || (bVar1 == 0x20)) {
LAB_0013f62c:
        lVar9 = 1;
        goto LAB_0013f62e;
      }
      if (bVar1 == 0x22) goto LAB_0013f601;
    }
LAB_0013f66d:
    if ((""[bVar1] & 0x46) == 0) {
LAB_0013f758:
      lVar9 = 2;
    }
    else {
      lVar12 = 0;
      lVar5 = -0x100000000;
      do {
        lVar5 = lVar5 + 0x100000000;
        lVar9 = lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while ((""[((byte *)zSql)[lVar9]] & 0x46) != 0);
      lVar9 = 2;
      uVar6 = (ulong)(bVar1 - 0x43);
      if (bVar1 - 0x43 < 0x32) {
        if ((0x100000001U >> (uVar6 & 0x3f) & 1) == 0) {
          iVar11 = (int)lVar12;
          pbVar4 = (byte *)zSql;
          if ((0x400000004U >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0x2000000020000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_0013fb4f;
            if (iVar11 == 4) {
              if ((byte *)zSql != (byte *)0x0) {
                lVar8 = 4;
                pcVar10 = "temp";
                lVar9 = 0;
                pbVar7 = (byte *)zSql;
                do {
                  if ((ulong)*pbVar7 == 0) {
                    pcVar10 = "temp" + lVar9;
                    goto LAB_0013fa48;
                  }
                  if (""[*pbVar7] != ""[(byte)*pcVar10]) goto LAB_0013fa48;
                  pbVar7 = pbVar7 + 1;
                  lVar9 = lVar9 + 1;
                  pcVar10 = (char *)((byte *)pcVar10 + 1);
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                lVar8 = 0;
                pcVar10 = "";
                pbVar7 = (byte *)zSql + 4;
LAB_0013fa48:
                lVar9 = 5;
                if (((int)lVar8 < 1) || (""[*pbVar7] == ""[(byte)*pcVar10])) goto LAB_0013fb4f;
              }
              if ((byte *)zSql != (byte *)0x0 && lVar12 == 9) {
LAB_0013fa9d:
                lVar12 = 9;
                pcVar10 = "temporary";
                lVar9 = 0;
                do {
                  if ((ulong)*pbVar4 == 0) {
                    pcVar10 = "temporary" + lVar9;
                    goto LAB_0013fb17;
                  }
                  if (""[*pbVar4] != ""[(byte)*pcVar10]) goto LAB_0013fb17;
                  pbVar4 = pbVar4 + 1;
                  lVar9 = lVar9 + 1;
                  pcVar10 = (char *)((byte *)pcVar10 + 1);
                  lVar12 = lVar12 + -1;
                } while (lVar12 != 0);
                lVar12 = 0;
                pcVar10 = "";
                pbVar4 = (byte *)zSql + 9;
LAB_0013fb17:
                lVar9 = 5;
                if ((int)lVar12 < 1) goto LAB_0013fb4f;
LAB_0013fb2b:
                bVar13 = ""[*pbVar4] == ""[(byte)*pcVar10];
                goto LAB_0013fb3b;
              }
            }
            else if (iVar11 == 9) {
              if ((byte *)zSql != (byte *)0x0) goto LAB_0013fa9d;
            }
            else if ((iVar11 == 7) && ((byte *)zSql != (byte *)0x0)) {
              lVar12 = 7;
              pbVar7 = (byte *)0x1e87c1;
              lVar9 = 0;
              do {
                if ((ulong)*pbVar4 == 0) {
                  pbVar7 = (byte *)("cannot use RETURNING in a trigger" + lVar9 + 0x1a);
                  goto LAB_0013f988;
                }
                if (""[*pbVar4] != ""[*pbVar7]) goto LAB_0013f988;
                pbVar4 = pbVar4 + 1;
                lVar9 = lVar9 + 1;
                pbVar7 = pbVar7 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
              lVar12 = 0;
              pbVar7 = (byte *)0x1e87c8;
              pbVar4 = (byte *)zSql + 7;
LAB_0013f988:
              lVar9 = 6;
              if (((int)lVar12 < 1) || (""[*pbVar4] == ""[*pbVar7])) goto LAB_0013fb4f;
            }
          }
          else if (iVar11 == 7) {
            if ((byte *)zSql != (byte *)0x0) {
LAB_0013f8fd:
              lVar12 = 7;
              pcVar10 = "explain";
              lVar9 = 0;
              do {
                if ((ulong)*pbVar4 == 0) {
                  pcVar10 = "explain" + lVar9;
                  goto LAB_0013f957;
                }
                if (""[*pbVar4] != ""[(byte)*pcVar10]) goto LAB_0013f957;
                pbVar4 = pbVar4 + 1;
                lVar9 = lVar9 + 1;
                pcVar10 = (char *)((byte *)pcVar10 + 1);
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
              lVar12 = 0;
              pcVar10 = "";
              pbVar4 = (byte *)zSql + 7;
LAB_0013f957:
              lVar9 = 3;
              if (0 < (int)lVar12) goto LAB_0013fb2b;
              goto LAB_0013fb4f;
            }
          }
          else if (iVar11 == 3) {
            if ((byte *)zSql != (byte *)0x0) {
              lVar8 = 3;
              pcVar10 = "end";
              lVar9 = 0;
              pbVar7 = (byte *)zSql;
              do {
                if ((ulong)*pbVar7 == 0) {
                  pcVar10 = "end" + lVar9;
                  goto LAB_0013f8a8;
                }
                if (""[*pbVar7] != ""[(byte)*pcVar10]) goto LAB_0013f8a8;
                pbVar7 = pbVar7 + 1;
                lVar9 = lVar9 + 1;
                pcVar10 = (char *)((byte *)pcVar10 + 1);
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
              lVar8 = 0;
              pcVar10 = "";
              pbVar7 = (byte *)zSql + 3;
LAB_0013f8a8:
              lVar9 = 7;
              if (((int)lVar8 < 1) || (""[*pbVar7] == ""[(byte)*pcVar10])) goto LAB_0013fb4f;
            }
            if ((byte *)zSql != (byte *)0x0 && lVar12 == 7) goto LAB_0013f8fd;
          }
LAB_0013fb44:
          lVar9 = 2;
        }
        else {
          if ((byte *)zSql == (byte *)0x0 || lVar12 != 6) goto LAB_0013fb44;
          lVar12 = 6;
          pcVar10 = "create";
          lVar9 = 0;
          pbVar4 = (byte *)zSql;
          do {
            if ((ulong)*pbVar4 == 0) {
              pcVar10 = "create" + lVar9;
              goto LAB_0013f866;
            }
            if (""[*pbVar4] != ""[(byte)*pcVar10]) goto LAB_0013f866;
            pbVar4 = pbVar4 + 1;
            lVar9 = lVar9 + 1;
            pcVar10 = (char *)((byte *)pcVar10 + 1);
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          lVar12 = 0;
          pcVar10 = "";
          pbVar4 = (byte *)zSql + 6;
LAB_0013f866:
          lVar9 = 4;
          if (0 < (int)lVar12) {
            bVar13 = ""[*pbVar4] == ""[(byte)*pcVar10];
LAB_0013fb3b:
            if (!bVar13) goto LAB_0013fb44;
          }
        }
      }
LAB_0013fb4f:
      zSql = (char *)((byte *)zSql + (lVar5 >> 0x20));
    }
  }
  else if (bVar1 < 0x3b) {
    if (bVar1 == 0x27) {
LAB_0013f601:
      do {
        bVar2 = ((byte *)zSql)[1];
        zSql = (char *)((byte *)zSql + 1);
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      if (bVar2 != 0) {
        lVar9 = 2;
        goto LAB_0013f62e;
      }
LAB_0013fb71:
      bVar13 = false;
LAB_0013fb7a:
      return (int)bVar13;
    }
    if (bVar1 == 0x2d) {
      lVar9 = 2;
      if (((byte *)zSql)[1] == 0x2d) {
        while( true ) {
          if (*zSql == 0) goto LAB_0013fb75;
          if (*zSql == 10) break;
          zSql = (char *)((byte *)zSql + 1);
        }
        goto LAB_0013f62c;
      }
    }
    else {
      if (bVar1 != 0x2f) goto LAB_0013f66d;
      lVar9 = 2;
      if (((byte *)zSql)[1] == 0x2a) {
        zSql = (char *)((byte *)zSql + 3);
        do {
          if (((byte *)zSql)[-1] == 0x2a) {
            if (*zSql == 0x2f) goto LAB_0013f75f;
          }
          else if (((byte *)zSql)[-1] == 0) goto LAB_0013fb71;
          zSql = (char *)((byte *)zSql + 1);
        } while( true );
      }
    }
  }
  else {
    if (bVar1 != 0x3b) {
      if (bVar1 == 0x60) goto LAB_0013f601;
      if (bVar1 != 0x5b) goto LAB_0013f66d;
      do {
        pbVar4 = (byte *)zSql + 1;
        if (*pbVar4 == 0) goto LAB_0013fb71;
        zSql = (char *)((byte *)zSql + 1);
      } while (*pbVar4 != 0x5d);
      goto LAB_0013f758;
    }
    lVar9 = 0;
  }
LAB_0013f62e:
  bVar3 = sqlite3_complete::trans[bVar3][lVar9];
  zSql = (char *)((byte *)zSql + 1);
  goto LAB_0013f548;
LAB_0013f75f:
  lVar9 = 1;
  goto LAB_0013f62e;
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simpler
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zSql==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}